

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdMath.cpp
# Opt level: O0

Object * __thiscall CmdMath::execute(CmdMath *this,Engine *engine)

{
  int iVar1;
  runtime_error *prVar2;
  ObjectInt *this_00;
  uint local_2c;
  int local_28;
  uint i;
  int result;
  Engine *engine_local;
  CmdMath *this_local;
  
  if (this->blocksCount != 0) {
    local_28 = executeInt(*this->blocks,engine);
    for (local_2c = 1; local_2c < this->blocksCount; local_2c = local_2c + 1) {
      switch(this->operation) {
      case PLUS:
        iVar1 = executeInt(this->blocks[local_2c],engine);
        local_28 = iVar1 + local_28;
        break;
      case MINUS:
        iVar1 = executeInt(this->blocks[local_2c],engine);
        local_28 = local_28 - iVar1;
        break;
      case MULTIPLY:
        iVar1 = executeInt(this->blocks[local_2c],engine);
        local_28 = iVar1 * local_28;
        break;
      case DIVIDE:
        iVar1 = executeInt(this->blocks[local_2c],engine);
        local_28 = local_28 / iVar1;
        break;
      default:
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"CmdMath::execute => unknown operation!");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    this_00 = (ObjectInt *)operator_new(0x10);
    ObjectInt::ObjectInt(this_00,local_28);
    return &this_00->super_Object;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"CmdMath::execute => no blocks!");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Object *CmdMath::execute(Engine *engine) {
	if (this->blocksCount == 0) {
		throw std::runtime_error("CmdMath::execute => no blocks!");
	}
	
	int result = executeInt(this->blocks[0], engine);
	unsigned int i;
	for (i = 1; i < this->blocksCount; i++) {
		switch (this->operation) {
			case PLUS:
				result += executeInt(this->blocks[i], engine);
				break;
			case MINUS:
				result -= executeInt(this->blocks[i], engine);
				break;
			case MULTIPLY:
				result *= executeInt(this->blocks[i], engine);
				break;
			case DIVIDE:
				result /= executeInt(this->blocks[i], engine);
				break;
			default:
				throw std::runtime_error("CmdMath::execute => unknown operation!");
		}
	}
	return new ObjectInt(result);
}